

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svg2png.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  long lVar2;
  ostream *poVar3;
  int iVar4;
  Bitmap bitmap;
  unique_ptr<lunasvg::Document,_std::default_delete<lunasvg::Document>_> document;
  uint32_t bgColor;
  uint32_t height;
  uint32_t width;
  string filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> basename;
  
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  filename._M_string_length = 0;
  filename.field_2._M_local_buf[0] = '\0';
  width = 0;
  height = 0;
  bgColor = 0;
  bVar1 = setup(argc,argv,&filename,&width,&height,&bgColor);
  if (bVar1) {
    lunasvg::Document::loadFromFile((Document *)&document,&filename);
    if ((__uniq_ptr_impl<lunasvg::Document,_std::default_delete<lunasvg::Document>_>)
        document._M_t.
        super___uniq_ptr_impl<lunasvg::Document,_std::default_delete<lunasvg::Document>_>._M_t.
        super__Tuple_impl<0UL,_lunasvg::Document_*,_std::default_delete<lunasvg::Document>_>.
        super__Head_base<0UL,_lunasvg::Document_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<lunasvg::Document,_std::default_delete<lunasvg::Document>_>)0x0) {
      help();
      iVar4 = 1;
    }
    else {
      lunasvg::Document::renderToBitmap
                ((Document *)&bitmap,
                 (int)document._M_t.
                      super___uniq_ptr_impl<lunasvg::Document,_std::default_delete<lunasvg::Document>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_lunasvg::Document_*,_std::default_delete<lunasvg::Document>_>
                      .super__Head_base<0UL,_lunasvg::Document_*,_false>._M_head_impl,width,height);
      if (bitmap.m_surface == (plutovg_surface_t *)0x0) {
        help();
        iVar4 = 1;
      }
      else {
        lVar2 = std::__cxx11::string::find_last_of((char *)&filename,0x13a0aa);
        if (lVar2 == -1) {
          std::__cxx11::string::string((string *)&basename,(string *)&filename);
        }
        else {
          std::__cxx11::string::substr((ulong)&basename,(ulong)&filename);
        }
        std::__cxx11::string::append((char *)&basename);
        lunasvg::Bitmap::writeToPng(&bitmap,&basename);
        poVar3 = std::operator<<((ostream *)&std::cout,"Generated PNG file: ");
        poVar3 = std::operator<<(poVar3,(string *)&basename);
        std::endl<char,std::char_traits<char>>(poVar3);
        std::__cxx11::string::~string((string *)&basename);
        iVar4 = 0;
      }
      lunasvg::Bitmap::~Bitmap(&bitmap);
    }
    std::unique_ptr<lunasvg::Document,_std::default_delete<lunasvg::Document>_>::~unique_ptr
              (&document);
  }
  else {
    help();
    iVar4 = 1;
  }
  std::__cxx11::string::~string((string *)&filename);
  return iVar4;
}

Assistant:

int main(int argc, char* argv[])
{
    std::string filename;
    std::uint32_t width = 0, height = 0;
    std::uint32_t bgColor = 0x00000000;
    if(!setup(argc, argv, filename, width, height, bgColor)) {
        return help();
    }

    auto document = Document::loadFromFile(filename);
    if(document == nullptr) {
        return help();
    }

    auto bitmap = document->renderToBitmap(width, height, bgColor);
    if(bitmap.isNull()) {
        return help();
    }

    auto lastSlashIndex = filename.find_last_of("/\\");
    auto basename = lastSlashIndex == std::string::npos ? filename : filename.substr(lastSlashIndex + 1);
    basename.append(".png");

    bitmap.writeToPng(basename);
    std::cout << "Generated PNG file: " << basename << std::endl;
    return 0;
}